

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionID.h
# Opt level: O0

void __thiscall FIX::SessionID::SessionID(SessionID *this)

{
  SessionID *this_local;
  
  BeginString::BeginString(&this->m_beginString);
  SenderCompID::SenderCompID(&this->m_senderCompID);
  TargetCompID::TargetCompID(&this->m_targetCompID);
  std::__cxx11::string::string((string *)&this->m_sessionQualifier);
  std::__cxx11::string::string((string *)&this->m_frozenString);
  toString(this,&this->m_frozenString);
  return;
}

Assistant:

SessionID() { toString(m_frozenString); }